

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_peak2_reinit(ma_peak2_config *pConfig,ma_peak2 *pFilter)

{
  ma_result mVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ma_biquad_config bqConfig;
  ma_biquad_config local_48;
  
  mVar1 = MA_INVALID_ARGS;
  if (pConfig != (ma_peak2_config *)0x0 && pFilter != (ma_peak2 *)0x0) {
    dVar4 = pConfig->q;
    dVar2 = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
    dVar3 = sin(dVar2);
    dVar2 = sin(1.5707963267948966 - dVar2);
    dVar3 = dVar3 / (dVar4 + dVar4);
    dVar4 = pow(10.0,pConfig->gainDB / 40.0);
    local_48.b0 = dVar3 * dVar4;
    local_48.b1 = dVar2 * -2.0;
    local_48.b2 = 1.0 - local_48.b0;
    local_48.b0 = local_48.b0 + 1.0;
    dVar3 = dVar3 / dVar4;
    local_48.a0 = dVar3 + 1.0;
    local_48.a2 = 1.0 - dVar3;
    local_48.format = pConfig->format;
    local_48.channels = pConfig->channels;
    local_48.a1 = local_48.b1;
    mVar1 = ma_biquad_reinit(&local_48,&pFilter->bq);
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_peak2_reinit(const ma_peak2_config* pConfig, ma_peak2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_peak2__get_biquad_config(pConfig);
    result = ma_biquad_reinit(&bqConfig, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}